

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O1

int __thiscall
llvm::DWARFExpression::Operation::verify
          (Operation *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  Encoding EVar1;
  DWARFAbbreviationDeclaration *pDVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  DWARFDie DVar6;
  
  lVar5 = 2;
  do {
    EVar1 = (this->Desc).Op[lVar5 + -2];
    if (EVar1 == SizeNA) {
      bVar3 = false;
      iVar4 = 2;
    }
    else {
      if (EVar1 == BaseTypeRef) {
        DVar6 = DWARFUnit::getDIEForOffset
                          ((DWARFUnit *)ctx,
                           *(long *)((long)&this->Desc + lVar5 * 8 + -1) + *(long *)(ctx + 0x18));
        if (((DVar6.Die == (DWARFDebugInfoEntry *)0x0 || DVar6.U == (DWARFUnit *)0x0) ||
            (pDVar2 = (DVar6.Die)->AbbrevDecl, pDVar2 == (DWARFAbbreviationDeclaration *)0x0)) ||
           (pDVar2->Tag != DW_TAG_base_type)) {
          this->Error = true;
          iVar4 = 1;
          bVar3 = false;
          goto LAB_00d8a9d7;
        }
      }
      iVar4 = 0;
      bVar3 = true;
    }
LAB_00d8a9d7:
    if (!bVar3) goto LAB_00d8a9e9;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 3);
  iVar4 = 2;
LAB_00d8a9e9:
  return (int)(iVar4 == 2);
}

Assistant:

bool DWARFExpression::Operation::verify(DWARFUnit *U) {

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];

    if (Size == Operation::SizeNA)
      break;

    if (Size == Operation::BaseTypeRef) {
      auto Die = U->getDIEForOffset(U->getOffset() + Operands[Operand]);
      if (!Die || Die.getTag() != dwarf::DW_TAG_base_type) {
        Error = true;
        return false;
      }
    }
  }

  return true;
}